

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O2

void __thiscall imrt::Plan::undoLast(Plan *this)

{
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> _Stack_28;
  
  if (this->last_changed != (Station *)0x0) {
    Station::undoLast_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&_Stack_28,
               this->last_changed);
    if (_Stack_28._M_impl._M_node._M_size != 0) {
      incremental_eval(this,this->last_changed,
                       (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &_Stack_28);
    }
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&_Stack_28);
  }
  return;
}

Assistant:

void Plan::undoLast() {
    if (last_changed==NULL) return;
    list< pair< int, double > > diff = last_changed->undoLast();
    if (diff.size()>0)
      incremental_eval (*last_changed, diff);
  }